

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void build_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
               int **_AdjB,int *AdjP)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  ulong uVar5;
  int *piVar6;
  reference ppVar7;
  pair<int,_int> *e_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  int curV;
  int curP;
  int *AdjB;
  int size_edge;
  pair<int,_int> local_6c [2];
  reference local_58;
  pair<int,_int> *e;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges_alter;
  int *AdjP_local;
  int **_AdjB_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  
  edges_alter.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)AdjP;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1);
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(edges);
  e = (pair<int,_int> *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(edges);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)&e), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&__end1);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1,
               local_58);
    local_6c[0] = std::make_pair<int_const&,int_const&>(&local_58->second,&local_58->first);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1,
               local_6c);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       &__range1);
  __last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      &__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,int(*)(std::pair<int,int>const&,std::pair<int,int>const&)>
            ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              )__last._M_current,cmp_edges);
  sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1
                    );
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)sVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar5);
  __range1_1._4_4_ = 0;
  __range1_1._0_4_ = -1;
  __end1_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        &__range1);
  e_1 = (pair<int,_int> *)
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                             *)&e_1), bVar3) {
    ppVar7 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator*(&__end1_1);
    iVar2 = (int)__range1_1;
    if (ppVar7->first != (int)__range1_1) {
      while (__range1_1._0_4_ = iVar2 + 1, (int)__range1_1 <= ppVar7->first) {
        (&(edges_alter.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage)->first)[(int)__range1_1] = __range1_1._4_4_;
        iVar2 = (int)__range1_1;
      }
    }
    __range1_1._0_4_ = iVar2;
    piVar6[__range1_1._4_4_] = ppVar7->second;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1_1);
    __range1_1._4_4_ = __range1_1._4_4_ + 1;
  }
  while (__range1_1._0_4_ = (int)__range1_1 + 1, (int)__range1_1 <= size) {
    (&(edges_alter.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage)->first)[(int)__range1_1] =
         __range1_1._4_4_;
  }
  *_AdjB = piVar6;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range1);
  return;
}

Assistant:

void build_adjacent_table(const vector<pair<int, int> > &edges, int **_AdjB, int *AdjP) {
    vector<pair<int, int> > edges_alter;
    for (auto &e : edges) {
        edges_alter.push_back(e);
        edges_alter.push_back(make_pair(e.second, e.first));
    }
    sort(edges_alter.begin(), edges_alter.end(), cmp_edges);
    int size_edge = edges_alter.size();
    int *AdjB = new int[size_edge];
    int curP = 0, curV = -1;
    for (auto &e: edges_alter) {
        if (e.first != curV) {
            //curV = e.first;
            for (curV += 1; curV <= e.first; ++curV)
                AdjP[curV] = curP;
            --curV;
        }
        AdjB[curP++] = e.second;
    }
    for (curV += 1; curV <= size; ++curV)
        AdjP[curV] = curP;
    
    *_AdjB = AdjB;
}